

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

char * retrieve_qos_value(QOS_VALUE value)

{
  char *pcStack_10;
  QOS_VALUE value_local;
  
  if (value == DELIVER_AT_MOST_ONCE) {
    pcStack_10 = "DELIVER_AT_MOST_ONCE";
  }
  else if (value == DELIVER_AT_LEAST_ONCE) {
    pcStack_10 = "DELIVER_AT_LEAST_ONCE";
  }
  else {
    pcStack_10 = "DELIVER_EXACTLY_ONCE";
  }
  return pcStack_10;
}

Assistant:

static const char* retrieve_qos_value(QOS_VALUE value)
{
    switch (value)
    {
        case DELIVER_AT_MOST_ONCE:
            return "DELIVER_AT_MOST_ONCE";
        case DELIVER_AT_LEAST_ONCE:
            return "DELIVER_AT_LEAST_ONCE";
        case DELIVER_EXACTLY_ONCE:
        default:
            return "DELIVER_EXACTLY_ONCE";
    }
}